

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::StreamArchive::write_entry
          (StreamArchive *this,ResourceTag tag,Hash hash,void *blob,size_t size,
          PayloadWriteFlags flags)

{
  undefined1 uVar1;
  size_t sVar2;
  int iVar3;
  undefined4 uVar4;
  iterator iVar5;
  size_t sVar6;
  mz_ulong mVar7;
  uint8_t *pDest;
  undefined1 uVar8;
  ulong __n;
  undefined1 uVar9;
  mz_ulong zsize;
  char str [41];
  Hash local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  size_t local_70;
  char local_68 [24];
  char local_50 [32];
  
  if (this->alive != true) {
    return false;
  }
  if (this->mode == ReadOnly) {
    return false;
  }
  local_90 = hash;
  iVar5 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->seen_blobs[tag]._M_h,&local_90);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
      ._M_cur != (__node_type *)0x0) {
    return true;
  }
  sprintf(local_68,"%0*x",0x18,(ulong)tag);
  sprintf(local_50,"%016lx",local_90);
  sVar6 = fwrite(local_68,1,0x28,(FILE *)this->file);
  if (sVar6 != 0x28) {
    return false;
  }
  if ((flags & 1) == 0) {
    uVar9 = (undefined1)(size >> 0x18);
    uVar8 = (undefined1)(size >> 8);
    uVar1 = (undefined1)(size >> 0x10);
    if ((flags & 2) != 0) {
      mVar7 = mz_compressBound(size);
      pDest = this->zlib_buffer;
      local_70 = this->zlib_buffer_size;
      if (local_70 < mVar7) {
        pDest = (uint8_t *)realloc(pDest,mVar7);
        local_70 = mVar7;
        if (pDest == (uint8_t *)0x0) {
          free(this->zlib_buffer);
          local_70 = 0;
        }
        this->zlib_buffer = pDest;
        this->zlib_buffer_size = local_70;
      }
      if (pDest == (uchar *)0x0) {
        return false;
      }
      iVar3 = mz_compress2(pDest,&local_70,(uchar *)blob,size,(flags & 4) * 2 + 1);
      sVar2 = local_70;
      if (iVar3 != 0) {
        return false;
      }
      uVar4 = 0;
      if ((flags & 8) != 0) {
        mVar7 = mz_crc32(0,this->zlib_buffer,local_70);
        uVar4 = (undefined4)mVar7;
      }
      local_88 = CONCAT44(2,(int)sVar2);
      uStack_80._0_5_ = CONCAT14((char)size,uVar4);
      uStack_80._0_6_ = CONCAT15(uVar8,(undefined5)uStack_80);
      uStack_80 = CONCAT17(uVar9,CONCAT16(uVar1,(undefined6)uStack_80));
      sVar6 = fwrite(&local_88,1,0x10,(FILE *)this->file);
      if (sVar6 != 0x10) {
        return false;
      }
      __n = sVar2 & 0xffffffff;
      sVar6 = fwrite(this->zlib_buffer,1,__n,(FILE *)this->file);
      if (sVar6 != __n) {
        return false;
      }
      goto LAB_0013e5dd;
    }
    uVar4 = 0;
    if ((flags & 8) != 0) {
      mVar7 = mz_crc32(0,(mz_uint8 *)blob,size);
      uVar4 = (undefined4)mVar7;
    }
    local_88 = CONCAT44(1,(int)size);
    uStack_80._0_5_ = CONCAT14((char)size,uVar4);
    uStack_80 = CONCAT17(uVar9,CONCAT16(uVar1,CONCAT15(uVar8,(undefined5)uStack_80)));
    sVar6 = fwrite(&local_88,1,0x10,(FILE *)this->file);
    if (sVar6 != 0x10) {
      return false;
    }
  }
  else if (size < 0x10) {
    return false;
  }
  sVar6 = fwrite(blob,1,size,(FILE *)this->file);
  if (sVar6 != size) {
    return false;
  }
LAB_0013e5dd:
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_long&,Fossilize::StreamArchive::Entry>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->seen_blobs[tag]._M_h,&local_90);
  return true;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t size, PayloadWriteFlags flags) override
	{
		if (!alive || mode == DatabaseMode::ReadOnly)
			return false;

		auto itr = seen_blobs[tag].find(hash);
		if (itr != end(seen_blobs[tag]))
			return true;

		char str[FOSSILIZE_BLOB_HASH_LENGTH + 1]; // 40 digits + null
		sprintf(str, "%0*x", FOSSILIZE_BLOB_HASH_LENGTH - 16, tag);
		sprintf(str + FOSSILIZE_BLOB_HASH_LENGTH - 16, "%016" PRIx64, hash);

		if (fwrite(str, 1, FOSSILIZE_BLOB_HASH_LENGTH, file) != FOSSILIZE_BLOB_HASH_LENGTH)
			return false;

		if ((flags & PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT) != 0)
		{
			// The raw payload already contains the header, so just dump it straight to disk.
			if (size < sizeof(PayloadHeaderRaw))
				return false;
			if (fwrite(blob, 1, size, file) != size)
				return false;
		}
		else if ((flags & PAYLOAD_WRITE_COMPRESS_BIT) != 0)
		{
			auto compressed_bound = mz_compressBound(size);

			if (zlib_buffer_size < compressed_bound)
			{
				auto *new_zlib_buffer = static_cast<uint8_t *>(realloc(zlib_buffer, compressed_bound));
				if (new_zlib_buffer)
				{
					zlib_buffer = new_zlib_buffer;
					zlib_buffer_size = compressed_bound;
				}
				else
				{
					free(zlib_buffer);
					zlib_buffer = nullptr;
					zlib_buffer_size = 0;
				}
			}

			if (!zlib_buffer)
				return false;

			PayloadHeader header = {};
			PayloadHeaderRaw header_raw = {};
			header.uncompressed_size = uint32_t(size);
			header.format = FOSSILIZE_COMPRESSION_DEFLATE;

			mz_ulong zsize = zlib_buffer_size;
			if (mz_compress2(zlib_buffer, &zsize, static_cast<const unsigned char *>(blob), size,
			                 (flags & PAYLOAD_WRITE_BEST_COMPRESSION_BIT) != 0 ? MZ_BEST_COMPRESSION : MZ_BEST_SPEED) != MZ_OK)
				return false;

			header.payload_size = uint32_t(zsize);
			if ((flags & PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT) != 0)
				header.crc = uint32_t(mz_crc32(MZ_CRC32_INIT, zlib_buffer, zsize));

			convert_to_le(header_raw, header);
			if (fwrite(&header_raw, 1, sizeof(header_raw), file) != sizeof(header_raw))
				return false;

			if (fwrite(zlib_buffer, 1, header.payload_size, file) != header.payload_size)
				return false;
		}
		else
		{
			uint32_t crc = 0;
			if ((flags & PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT) != 0)
				crc = uint32_t(mz_crc32(MZ_CRC32_INIT, static_cast<const unsigned char *>(blob), size));

			PayloadHeader header = { uint32_t(size), FOSSILIZE_COMPRESSION_NONE, crc, uint32_t(size) };
			PayloadHeaderRaw raw = {};
			convert_to_le(raw, header);

			if (fwrite(&raw, 1, sizeof(raw), file) != sizeof(raw))
				return false;

			if (fwrite(blob, 1, size, file) != size)
				return false;
		}

		// The entry is irrelevant, we're not going to read from this archive any time soon.
		seen_blobs[tag].emplace(hash, Entry{});
		return true;
	}